

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-metrics.c
# Opt level: O3

void metrics_routine_cb(void *arg)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  uint64_t *puVar3;
  int64_t eval_b;
  int64_t eval_a;
  int cntr;
  uv_timer_t timer;
  uv_loop_t loop;
  uint64_t uStack_4e0;
  uint64_t uStack_4d8;
  int iStack_4cc;
  uv_metrics_t uStack_4c8;
  uv_timer_t uStack_448;
  uv_loop_t *puStack_3d0;
  undefined8 local_3c0;
  uint64_t local_3b8;
  int local_3ac;
  uv_timer_t local_3a8;
  uv_loop_t local_330;
  
  local_3a8.data = &local_3ac;
  local_3ac = 0;
  puStack_3d0 = (uv_loop_t *)0x1a93b5;
  iVar1 = uv_loop_init(&local_330);
  local_3b8 = (uint64_t)iVar1;
  local_3c0 = 0;
  if (local_3b8 == 0) {
    puStack_3d0 = (uv_loop_t *)0x1a93e9;
    iVar1 = uv_loop_configure(&local_330,UV_METRICS_IDLE_TIME);
    local_3b8 = (uint64_t)iVar1;
    local_3c0 = 0;
    if (local_3b8 != 0) goto LAB_001a954f;
    puStack_3d0 = (uv_loop_t *)0x1a941b;
    iVar1 = uv_timer_init(&local_330,&local_3a8);
    local_3b8 = (uint64_t)iVar1;
    local_3c0 = 0;
    if (local_3b8 != 0) goto LAB_001a955e;
    puStack_3d0 = (uv_loop_t *)0x1a9453;
    iVar1 = uv_timer_start(&local_3a8,timer_spin_cb,1000,0);
    local_3b8 = (uint64_t)iVar1;
    local_3c0 = 0;
    if (local_3b8 != 0) goto LAB_001a956d;
    puStack_3d0 = (uv_loop_t *)0x1a9482;
    iVar1 = uv_run(&local_330,UV_RUN_DEFAULT);
    local_3b8 = (uint64_t)iVar1;
    local_3c0 = 0;
    if (local_3b8 != 0) goto LAB_001a957c;
    local_3b8 = (uint64_t)local_3ac;
    local_3c0 = 0;
    if ((long)local_3b8 < 1) goto LAB_001a958b;
    puStack_3d0 = (uv_loop_t *)0x1a94d2;
    local_3b8 = uv_metrics_idle_time(&local_330);
    local_3c0 = 500000000;
    if ((long)local_3b8 < 500000000) goto LAB_001a959a;
    unaff_RBX = &local_330;
    puStack_3d0 = (uv_loop_t *)0x1a9509;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_3d0 = (uv_loop_t *)0x1a9513;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_3d0 = (uv_loop_t *)0x1a951b;
    iVar1 = uv_loop_close(unaff_RBX);
    local_3b8 = (uint64_t)iVar1;
    local_3c0 = 0;
    if (local_3b8 == 0) {
      return;
    }
  }
  else {
    puStack_3d0 = (uv_loop_t *)0x1a954f;
    metrics_routine_cb_cold_1();
LAB_001a954f:
    puStack_3d0 = (uv_loop_t *)0x1a955e;
    metrics_routine_cb_cold_2();
LAB_001a955e:
    puStack_3d0 = (uv_loop_t *)0x1a956d;
    metrics_routine_cb_cold_3();
LAB_001a956d:
    puStack_3d0 = (uv_loop_t *)0x1a957c;
    metrics_routine_cb_cold_4();
LAB_001a957c:
    puStack_3d0 = (uv_loop_t *)0x1a958b;
    metrics_routine_cb_cold_5();
LAB_001a958b:
    puStack_3d0 = (uv_loop_t *)0x1a959a;
    metrics_routine_cb_cold_6();
LAB_001a959a:
    puStack_3d0 = (uv_loop_t *)0x1a95a9;
    metrics_routine_cb_cold_8();
  }
  puStack_3d0 = (uv_loop_t *)run_test_metrics_idle_time_zero;
  metrics_routine_cb_cold_7();
  puVar3 = &uStack_4e0;
  uStack_448.data = &iStack_4cc;
  iStack_4cc = 0;
  puStack_3d0 = unaff_RBX;
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_configure(puVar2,UV_METRICS_IDLE_TIME);
  uStack_4c8.loop_count = (uint64_t)iVar1;
  uStack_4e0 = 0;
  if (uStack_4c8.loop_count == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_timer_init(puVar2,&uStack_448);
    uStack_4c8.loop_count = (uint64_t)iVar1;
    uStack_4e0 = 0;
    if (uStack_4c8.loop_count != 0) goto LAB_001a979e;
    iVar1 = uv_timer_start(&uStack_448,timer_noop_cb,0,0);
    uStack_4c8.loop_count = (uint64_t)iVar1;
    uStack_4e0 = 0;
    if (uStack_4c8.loop_count != 0) goto LAB_001a97ab;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    uStack_4c8.loop_count = (uint64_t)iVar1;
    uStack_4e0 = 0;
    if (uStack_4c8.loop_count != 0) goto LAB_001a97b8;
    uStack_4c8.loop_count = (uint64_t)iStack_4cc;
    uStack_4e0 = 0;
    if ((long)uStack_4c8.loop_count < 1) goto LAB_001a97c5;
    puVar2 = uv_default_loop();
    uStack_4c8.loop_count = uv_metrics_idle_time(puVar2);
    uStack_4e0 = 0;
    if (uStack_4c8.loop_count != 0) goto LAB_001a97d2;
    puVar2 = uv_default_loop();
    iVar1 = uv_metrics_info(puVar2,&uStack_4c8);
    uStack_4e0 = (uint64_t)iVar1;
    uStack_4d8 = 0;
    if (uStack_4e0 != 0) goto LAB_001a97df;
    uStack_4e0 = (uint64_t)iStack_4cc;
    uStack_4d8 = uStack_4c8.loop_count;
    if (uStack_4e0 == uStack_4c8.loop_count) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      uStack_4e0 = 0;
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      uStack_4d8 = (uint64_t)iVar1;
      if (uStack_4e0 == uStack_4d8) {
        uv_library_shutdown();
        return;
      }
      goto LAB_001a97f9;
    }
  }
  else {
    run_test_metrics_idle_time_zero_cold_1();
LAB_001a979e:
    run_test_metrics_idle_time_zero_cold_2();
LAB_001a97ab:
    run_test_metrics_idle_time_zero_cold_3();
LAB_001a97b8:
    run_test_metrics_idle_time_zero_cold_4();
LAB_001a97c5:
    run_test_metrics_idle_time_zero_cold_5();
LAB_001a97d2:
    run_test_metrics_idle_time_zero_cold_6();
LAB_001a97df:
    run_test_metrics_idle_time_zero_cold_7();
  }
  run_test_metrics_idle_time_zero_cold_8();
LAB_001a97f9:
  run_test_metrics_idle_time_zero_cold_9();
  *(int *)*puVar3 = *(int *)*puVar3 + 1;
  return;
}

Assistant:

static void metrics_routine_cb(void* arg) {
  const uint64_t timeout = 1000;
  uv_loop_t loop;
  uv_timer_t timer;
  uint64_t idle_time;
  int cntr;

  cntr = 0;
  timer.data = &cntr;

  ASSERT_OK(uv_loop_init(&loop));
  ASSERT_OK(uv_loop_configure(&loop, UV_METRICS_IDLE_TIME));
  ASSERT_OK(uv_timer_init(&loop, &timer));
  ASSERT_OK(uv_timer_start(&timer, timer_spin_cb, timeout, 0));

  ASSERT_OK(uv_run(&loop, UV_RUN_DEFAULT));
  ASSERT_GT(cntr, 0);

  idle_time = uv_metrics_idle_time(&loop);

  /* Only checking that idle time is greater than the lower bound since there
   * may have been thread contention, causing the event loop to be delayed in
   * the idle phase longer than expected.
   */
  ASSERT_GE(idle_time, (timeout - 500) * UV_NS_TO_MS);

  close_loop(&loop);
  ASSERT_OK(uv_loop_close(&loop));
}